

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O2

boolean doorlock(obj *otmp,int x,int y)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  monst *mtmp;
  bool bVar5;
  rm (*parVar6) [21];
  level *plVar7;
  boolean bVar8;
  boolean bVar9;
  int iVar10;
  trap *ptVar11;
  char *pcVar12;
  xchar x_00;
  xchar y_00;
  char *local_48;
  
  plVar7 = level;
  parVar6 = level->locations;
  iVar10 = artifact_door(level,x,y);
  uVar3 = otmp->otyp;
  if (plVar7->locations[x][y].typ == '\x0f') {
    if (((uVar3 - 0x186 < 2) || (uVar3 == 0x1cc)) || (uVar3 == 0x1c4)) {
      if (iVar10 == 0) {
        plVar7->locations[x][y].typ = '\x17';
        *(uint *)&plVar7->locations[x][y].field_0x6 =
             *(uint *)&plVar7->locations[x][y].field_0x6 & 0xffffff0f | 0x40;
      }
      else {
        cvt_sdoor_to_door(parVar6[x] + y,&u.uz);
      }
      newsym(x,y);
      if ((viz_array[y][x] & 2U) != 0) {
        pline("A door appears in the wall!");
      }
      uVar3 = otmp->otyp;
      if (uVar3 == 0x186) {
        return '\x01';
      }
      if (uVar3 == 0x1cc) {
        return '\x01';
      }
      goto LAB_001af9cd;
    }
    goto LAB_001afbf8;
  }
LAB_001af9cd:
  y_00 = (xchar)y;
  x_00 = (xchar)x;
  if (uVar3 == 0x186) {
LAB_001afa5f:
    if ((iVar10 != 0) || (uVar4 = *(uint *)&plVar7->locations[x][y].field_0x6, -1 < (char)uVar4))
    goto LAB_001afbf8;
    *(uint *)&plVar7->locations[x][y].field_0x6 = uVar4 & 0xffffff0f | 0x40;
    local_48 = "The door unlocks!";
    bVar5 = true;
    goto LAB_001afa8e;
  }
  if (uVar3 == 0x187) {
LAB_001afae0:
    if ((iVar10 != 0) || (uVar4 = *(uint *)&plVar7->locations[x][y].field_0x6, (uVar4 & 0xc0) == 0))
    goto LAB_001afbf8;
    if ((uVar4 >> 8 & 1) == 0) {
      *(uint *)&plVar7->locations[x][y].field_0x6 = uVar4 & 0xfffffe0f | 0x10;
      if (flags.verbose != '\0') {
        if ((viz_array[y][x] & 2U) == 0) {
          if (flags.soundok != '\0') {
            You_hear("a crashing sound.");
          }
        }
        else {
          pline("The door crashes open!");
        }
      }
      unblock_point(x,y);
      newsym(x,y);
      iVar10 = 0x14;
      if (vision_full_recalc != '\0') {
        vision_recalc(0);
      }
    }
    else {
      mtmp = level->monsters[x][y];
      if ((mtmp == (monst *)0x0) || ((mtmp->field_0x61 & 2) != 0)) {
        if (flags.verbose != '\0') {
          if ((viz_array[y][x] & 2U) == 0) {
            if (flags.soundok != '\0') {
              You_hear("a distant explosion.");
            }
          }
          else {
            pline("KABOOM!!  You see a door explode.");
          }
        }
      }
      else {
        mb_trapped(mtmp);
      }
      puVar1 = &plVar7->locations[x][y].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
      unblock_point(x,y);
      newsym(x,y);
      iVar10 = 0x28;
    }
    wake_nearto(x,y,iVar10);
    pcVar12 = in_rooms(level,x_00,y_00,0x12);
    if (*pcVar12 != '\0') {
      add_damage(x_00,y_00,0);
    }
    goto LAB_001afdb4;
  }
  if (uVar3 != 0x1cd) {
    if (uVar3 == 0x1c4) goto LAB_001afae0;
    if (uVar3 == 0x1cc) goto LAB_001afa5f;
    if (uVar3 == 0x18c) goto LAB_001afa0e;
    warning("magic (%d) attempted on door.",(ulong)(uint)(int)(short)uVar3);
    goto LAB_001afdb4;
  }
LAB_001afa0e:
  bVar8 = on_level(&u.uz,&dungeon_topology.d_rogue_level);
  if (bVar8 != '\0') {
    bVar2 = viz_array[y][x];
    if ((bVar2 & 2) == 0) {
      You_hear("a swoosh.");
    }
    else {
      pline("%s springs up in the older, more primitive doorway.","A cloud of dust");
    }
    bVar8 = obstructed(x,y);
    if (bVar8 == '\0') {
      block_point(x,y);
      plVar7->locations[x][y].typ = '\x0f';
      if ((bVar2 & 2) != 0) {
        pline("The doorway vanishes!");
      }
      newsym(x,y);
      return '\x01';
    }
    if ((bVar2 & 2) != 0) {
      pline("The cloud %s.","quickly dissipates");
      return '\0';
    }
    goto LAB_001afbf8;
  }
  bVar8 = obstructed(x,y);
  if (bVar8 != '\0') goto LAB_001afbf8;
  ptVar11 = t_at(level,x,y);
  if (ptVar11 != (trap *)0x0) {
    pline("%s springs up in the doorway, but %s.","A cloud of dust","quickly dissipates");
    return '\0';
  }
  switch(*(uint *)&plVar7->locations[x][y].field_0x6 >> 4 & 0xf) {
  case 0:
    bVar5 = true;
    local_48 = "A cloud of dust springs up and assembles itself into a door!";
    goto LAB_001afe40;
  case 1:
    pcVar12 = "The broken door reassembles and locks!";
    local_48 = "The broken door reassembles!";
    break;
  case 2:
    pcVar12 = "The door swings shut, and locks!";
    local_48 = "The door swings shut!";
    break;
  default:
    local_48 = (char *)0x0;
    bVar5 = false;
    goto LAB_001afe40;
  case 4:
    pcVar12 = "The door locks!";
    local_48 = "The door closes!";
  }
  bVar5 = true;
  if (iVar10 == 0) {
    local_48 = pcVar12;
  }
LAB_001afe40:
  block_point(x,y);
  *(uint *)&plVar7->locations[x][y].field_0x6 =
       (uint)(iVar10 == 0) * 0x40 + (*(uint *)&plVar7->locations[x][y].field_0x6 & 0xffffff0f) +
       0x40;
  newsym(x,y);
  if (local_48 != (char *)0x0) {
LAB_001afa8e:
    if ((viz_array[y][x] & 2U) != 0) {
      pline(local_48);
      puVar1 = &level->locations[x][y].field_0x6;
      *(uint *)puVar1 = *(uint *)puVar1 | 1;
      map_background(x_00,y_00,1);
    }
  }
  if (bVar5) {
LAB_001afdb4:
    bVar9 = picking_at(x,y);
    bVar8 = '\x01';
    if (bVar9 != '\0') {
      stop_occupation();
      reset_pick();
    }
  }
  else {
LAB_001afbf8:
    bVar8 = '\0';
  }
  return bVar8;
}

Assistant:

boolean doorlock(struct obj *otmp, int x, int y)
{
	struct rm *door = &level->locations[x][y];
	boolean res = TRUE;
	int loudness = 0;
	const char *msg = NULL;
	const char *dustcloud = "A cloud of dust";
	const char *quickly_dissipates = "quickly dissipates";
	int key = artifact_door(level, x, y);	/* ALI - Artifact doors */

	if (door->typ == SDOOR) {
	    switch (otmp->otyp) {
	    case WAN_OPENING:
	    case SPE_KNOCK:
	    case WAN_STRIKING:
	    case SPE_FORCE_BOLT:
		if (key) {
		    /* Artifact doors are revealed only */
		    cvt_sdoor_to_door(door, &u.uz);
		} else {
		    door->typ = DOOR;
		    door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
		}
		newsym(x,y);
		if (cansee(x,y)) pline("A door appears in the wall!");
		if (otmp->otyp == WAN_OPENING || otmp->otyp == SPE_KNOCK)
		    return TRUE;
		break;		/* striking: continue door handling below */
	    case WAN_LOCKING:
	    case SPE_WIZARD_LOCK:
	    default:
		return FALSE;
	    }
	}

	switch(otmp->otyp) {
	case WAN_LOCKING:
	case SPE_WIZARD_LOCK:
	    if (Is_rogue_level(&u.uz)) {
	    	boolean vis = cansee(x,y);
		/* Can't have real locking in Rogue, so just hide doorway */
		if (vis) pline("%s springs up in the older, more primitive doorway.",
			dustcloud);
		else
			You_hear("a swoosh.");
		if (obstructed(x,y)) {
			if (vis) pline("The cloud %s.",quickly_dissipates);
			return FALSE;
		}
		block_point(x, y);
		door->typ = SDOOR;
		if (vis) pline("The doorway vanishes!");
		newsym(x,y);
		return TRUE;
	    }
	    if (obstructed(x,y)) return FALSE;
	    /* Don't allow doors to close over traps.  This is for pits */
	    /* & trap doors, but is it ever OK for anything else? */
	    if (t_at(level, x, y)) {
		/* maketrap() clears doormask, so it should be NODOOR */
		pline("%s springs up in the doorway, but %s.",
		      dustcloud, quickly_dissipates);
		return FALSE;
	    }

	    switch (door->doormask & ~D_TRAPPED) {
	    case D_CLOSED:
		msg = key ? "The door closes!" :
			    "The door locks!";
		break;
	    case D_ISOPEN:
		msg = key ? "The door swings shut!" :
			    "The door swings shut, and locks!";
		break;
	    case D_BROKEN:
		msg = key ? "The broken door reassembles!" :
			    "The broken door reassembles and locks!";
		break;
	    case D_NODOOR:
		msg =
		"A cloud of dust springs up and assembles itself into a door!";
		break;
	    default:
		res = FALSE;
		break;
	    }
	    block_point(x, y);
	    door->doormask = (key ? D_CLOSED : D_LOCKED) |
			     (door->doormask & D_TRAPPED);
	    newsym(x,y);
	    break;
	case WAN_OPENING:
	case SPE_KNOCK:
	    if (!key && door->doormask & D_LOCKED) {
		msg = "The door unlocks!";
		door->doormask = D_CLOSED | (door->doormask & D_TRAPPED);
	    } else res = FALSE;
	    break;
	case WAN_STRIKING:
	case SPE_FORCE_BOLT:
	    if (!key && door->doormask & (D_LOCKED | D_CLOSED)) {
		if (door->doormask & D_TRAPPED) {
		    if (MON_AT(level, x, y))
			mb_trapped(m_at(level, x,y));
		    else if (flags.verbose) {
			if (cansee(x,y))
			    pline("KABOOM!!  You see a door explode.");
			else if (flags.soundok)
			    You_hear("a distant explosion.");
		    }
		    door->doormask = D_NODOOR;
		    unblock_point(x,y);
		    newsym(x,y);
		    loudness = 40;
		    break;
		}
		door->doormask = D_BROKEN;
		if (flags.verbose) {
		    if (cansee(x,y))
			pline("The door crashes open!");
		    else if (flags.soundok)
			You_hear("a crashing sound.");
		}
		unblock_point(x,y);
		newsym(x,y);
		/* force vision recalc before printing more messages */
		if (vision_full_recalc) vision_recalc(0);
		loudness = 20;
	    } else res = FALSE;
	    break;
	default: warning("magic (%d) attempted on door.", otmp->otyp);
	    break;
	}
	if (msg && cansee(x,y)) {
	    pline(msg);
	    /* we know whether it's locked now */
	    level->locations[x][y].mem_door_l = 1;
	    map_background(x, y, TRUE);
	}
	if (loudness > 0) {
	    /* door was destroyed */
	    wake_nearto(x, y, loudness);
	    if (*in_rooms(level, x, y, SHOPBASE)) add_damage(x, y, 0L);
	}

	if (res && picking_at(x, y)) {
	    /* maybe unseen monster zaps door you're unlocking */
	    stop_occupation();
	    reset_pick();
	}
	return res;
}